

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::rule::
replace_top<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,std::vector<pstore::repo::linked_definitions::value_type,std::allocator<pstore::repo::linked_definitions::value_type>>*,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*>
          (rule *this,
          vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
          *args,back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
                *args_1)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  *this_00;
  __single_object p;
  __uniq_ptr_impl<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
  local_28;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  *args_local_1;
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  *args_local;
  
  args_local_1 = args_1;
  args_local = args;
  std::
  make_unique<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,std::vector<pstore::repo::linked_definitions::value_type,std::allocator<pstore::repo::linked_definitions::value_type>>*&,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>*&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&p,
             (vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
              **)&this->context_,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              **)&args_local);
  log_top(this,false);
  this_00 = &((this->context_).ptr_)->stack;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
  ::pop_back(&this_00->c);
  local_28._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
  .
  super__Head_base<0UL,_pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_false>
  ._M_head_impl =
       (tuple<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
        )(tuple<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
          )p;
  p._M_t.
  super___uniq_ptr_impl<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
  .
  super__Head_base<0UL,_pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>,_true,_true>
        )(__uniq_ptr_impl<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
          )0x0;
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
  ::
  emplace_back<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
            ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
              *)this_00,
             (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
              *)&local_28);
  if ((_Tuple_impl<0UL,_pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
       )local_28._M_t.
        super__Tuple_impl<0UL,_pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
        .
        super__Head_base<0UL,_pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_false>
        ._M_head_impl !=
      (linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
       *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
                          .
                          super__Head_base<0UL,_pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  log_top(this,true);
  uVar2 = std::_V2::system_category();
  std::
  unique_ptr<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>,_std::default_delete<pstore::exchange::import_ns::linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>_>_>
  ::~unique_ptr(&p);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return (error_code)(auVar1 << 0x40);
}

Assistant:

std::error_code replace_top (Args... args) {
                    auto p = std::make_unique<T> (context_, args...);
                    this->log_top (false);
                    // Remember the context pointer before we destroy 'this'.
                    auto * const context = this->get_context ();
                    context->stack.pop (); // Destroys this object.
                    context->stack.push (std::move (p));
                    this->log_top (true);
                    return {};
                }